

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  uVar4 = 4;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) {
      return 0;
    }
    if (iVar3 != 0x4e) goto LAB_003f7a4d;
    if (argc <= globalUtilOptind) break;
    uVar4 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
LAB_003f7a4d:
      Abc_Print(-2,"usage: |test [-N num] [-vh]\n");
      Abc_Print(-2,"\t         experiments with SOPs\n");
      Abc_Print(-2,"\t-N num : the number of variables [default = %d]\n",(ulong)uVar4);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_003f7a4d;
}

Assistant:

int Abc_CommandTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkExploreMem( Wlc_Ntk_t * p, int nFrames );
    extern void Wlc_NtkSimulateTest( Wlc_Ntk_t * p );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
//    if ( pNtk == NULL )
//    {
//        Abc_Print( 1, "Abc_CommandTest(): There is no current design.\n" );
//        return 0;
//    }

    // transform
    //pNtk = Wlc_NtkUifNodePairs( pNtk, NULL );
    //pNtk = Wlc_NtkAbstractNodes( pNtk, NULL );
    //Wlc_AbcUpdateNtk( pAbc, pNtk );
    //Wlc_GenerateSmtStdout( pAbc );
    //Wlc_NtkSimulateTest( (Wlc_Ntk_t *)pAbc->pAbcWlc );
    //pNtk = Wlc_NtkDupSingleNodes( pNtk );
    //Wlc_AbcUpdateNtk( pAbc, pNtk );
    //Wln_ReadNdrTest();
    //pNtk = Wlc_NtkMemAbstractTest( pNtk );
    //Wlc_AbcUpdateNtk( pAbc, pNtk );
    //Wln_NtkFromWlcTest( pNtk );
    Wlc_NtkExploreMem( pNtk, 0 );
    return 0;
usage:
    Abc_Print( -2, "usage: %%test [-vh]\n" );
    Abc_Print( -2, "\t         experiments with word-level networks\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}